

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_read_support_format_tar.c
# Opt level: O3

wchar_t header_common(archive_read *a,tar *tar,archive_entry *entry,void *h)

{
  byte bVar1;
  int iVar2;
  wchar_t wVar3;
  wchar_t wVar4;
  int64_t iVar5;
  la_int64_t lVar6;
  char *pcVar7;
  uint uVar8;
  archive_string_conv *sconv;
  
  if (*(char *)((long)h + 0x9d) == '\0') {
    (tar->entry_linkpath).length = 0;
  }
  else {
    (tar->entry_linkpath).length = 0;
    archive_strncat(&tar->entry_linkpath,(void *)((long)h + 0x9d),100);
  }
  iVar5 = tar_atol((char *)((long)h + 100),8);
  archive_entry_set_mode(entry,(mode_t)iVar5);
  iVar5 = tar_atol((char *)((long)h + 0x6c),8);
  archive_entry_set_uid(entry,iVar5);
  iVar5 = tar_atol((char *)((long)h + 0x74),8);
  archive_entry_set_gid(entry,iVar5);
  iVar5 = tar_atol((char *)((long)h + 0x7c),0xc);
  tar->entry_bytes_remaining = iVar5;
  if (iVar5 < 0) {
    tar->entry_bytes_remaining = 0;
    pcVar7 = "Tar entry has negative size";
LAB_00634062:
    archive_set_error(&a->archive,-1,pcVar7);
    return L'\xffffffe2';
  }
  if (iVar5 == 0x7fffffffffffffff) {
    tar->entry_bytes_remaining = 0;
    pcVar7 = "Tar entry size overflow";
    goto LAB_00634062;
  }
  tar->realsize = iVar5;
  archive_entry_set_size(entry,iVar5);
  iVar5 = tar_atol((char *)((long)h + 0x88),0xc);
  archive_entry_set_mtime(entry,iVar5,0);
  bVar1 = *(byte *)((long)h + 0x9c);
  if (bVar1 < 0x44) {
    switch(bVar1) {
    case 0x30:
switchD_006340e3_caseD_30:
      tar->sparse_allowed = 1;
    default:
switchD_006340e3_default:
      uVar8 = 0x8000;
LAB_0063416b:
      archive_entry_set_filetype(entry,uVar8);
      return L'\0';
    case 0x31:
      pcVar7 = (tar->entry_linkpath).s;
      wVar3 = _archive_entry_copy_hardlink_l(entry,pcVar7,(tar->entry_linkpath).length,tar->sconv);
      wVar4 = (wchar_t)pcVar7;
      if (wVar3 == L'\0') {
        wVar3 = L'\0';
      }
      else {
        sconv = tar->sconv;
        wVar3 = set_conversion_failed_error(a,sconv,"Linkname");
        wVar4 = (wchar_t)sconv;
        if (wVar3 == L'\xffffffe2') {
          return L'\xffffffe2';
        }
      }
      lVar6 = archive_entry_size(entry);
      if (0 < lVar6) {
        wVar4 = L'耀';
        archive_entry_set_filetype(entry,0x8000);
      }
      lVar6 = archive_entry_size(entry);
      if (lVar6 == 0) {
        return wVar3;
      }
      iVar2 = (a->archive).archive_format;
      if (iVar2 != 0x30004) {
        if (iVar2 == 0x30002) {
          return wVar3;
        }
        if ((iVar2 != 0x30000) && (wVar4 = archive_read_format_tar_bid(a,wVar4), wVar4 < L'3')) {
          return wVar3;
        }
      }
      archive_entry_set_size(entry,0);
      tar->entry_bytes_remaining = 0;
      return wVar3;
    case 0x32:
      archive_entry_set_filetype(entry,0xa000);
      archive_entry_set_size(entry,0);
      tar->entry_bytes_remaining = 0;
      wVar3 = _archive_entry_copy_symlink_l
                        (entry,(tar->entry_linkpath).s,(tar->entry_linkpath).length,tar->sconv);
      if (wVar3 == L'\0') {
        return L'\0';
      }
      wVar3 = set_conversion_failed_error(a,tar->sconv,"Linkname");
      return wVar3;
    case 0x33:
      uVar8 = 0x2000;
      break;
    case 0x34:
      uVar8 = 0x6000;
      break;
    case 0x35:
      uVar8 = 0x4000;
      break;
    case 0x36:
      uVar8 = 0x1000;
    }
    archive_entry_set_filetype(entry,uVar8);
    archive_entry_set_size(entry,0);
    tar->entry_bytes_remaining = 0;
    return L'\0';
  }
  if (bVar1 < 0x4e) {
    if (bVar1 == 0x44) {
      uVar8 = 0x4000;
      goto LAB_0063416b;
    }
    if (bVar1 == 0x4d) {
      return L'\0';
    }
  }
  else if ((bVar1 != 0x4e) && (bVar1 == 0x53)) goto switchD_006340e3_caseD_30;
  goto switchD_006340e3_default;
}

Assistant:

static int
header_common(struct archive_read *a, struct tar *tar,
    struct archive_entry *entry, const void *h)
{
	const struct archive_entry_header_ustar	*header;
	char	tartype;
	int     err = ARCHIVE_OK;

	header = (const struct archive_entry_header_ustar *)h;
	if (header->linkname[0])
		archive_strncpy(&(tar->entry_linkpath),
		    header->linkname, sizeof(header->linkname));
	else
		archive_string_empty(&(tar->entry_linkpath));

	/* Parse out the numeric fields (all are octal) */
	archive_entry_set_mode(entry,
		(mode_t)tar_atol(header->mode, sizeof(header->mode)));
	archive_entry_set_uid(entry, tar_atol(header->uid, sizeof(header->uid)));
	archive_entry_set_gid(entry, tar_atol(header->gid, sizeof(header->gid)));
	tar->entry_bytes_remaining = tar_atol(header->size, sizeof(header->size));
	if (tar->entry_bytes_remaining < 0) {
		tar->entry_bytes_remaining = 0;
		archive_set_error(&a->archive, ARCHIVE_ERRNO_MISC,
		    "Tar entry has negative size");
		return (ARCHIVE_FATAL);
	}
	if (tar->entry_bytes_remaining == INT64_MAX) {
		/* Note: tar_atol returns INT64_MAX on overflow */
		tar->entry_bytes_remaining = 0;
		archive_set_error(&a->archive, ARCHIVE_ERRNO_MISC,
		    "Tar entry size overflow");
		return (ARCHIVE_FATAL);
	}
	tar->realsize = tar->entry_bytes_remaining;
	archive_entry_set_size(entry, tar->entry_bytes_remaining);
	archive_entry_set_mtime(entry, tar_atol(header->mtime, sizeof(header->mtime)), 0);

	/* Handle the tar type flag appropriately. */
	tartype = header->typeflag[0];

	switch (tartype) {
	case '1': /* Hard link */
		if (archive_entry_copy_hardlink_l(entry, tar->entry_linkpath.s,
		    archive_strlen(&(tar->entry_linkpath)), tar->sconv) != 0) {
			err = set_conversion_failed_error(a, tar->sconv,
			    "Linkname");
			if (err == ARCHIVE_FATAL)
				return (err);
		}
		/*
		 * The following may seem odd, but: Technically, tar
		 * does not store the file type for a "hard link"
		 * entry, only the fact that it is a hard link.  So, I
		 * leave the type zero normally.  But, pax interchange
		 * format allows hard links to have data, which
		 * implies that the underlying entry is a regular
		 * file.
		 */
		if (archive_entry_size(entry) > 0)
			archive_entry_set_filetype(entry, AE_IFREG);

		/*
		 * A tricky point: Traditionally, tar readers have
		 * ignored the size field when reading hardlink
		 * entries, and some writers put non-zero sizes even
		 * though the body is empty.  POSIX blessed this
		 * convention in the 1988 standard, but broke with
		 * this tradition in 2001 by permitting hardlink
		 * entries to store valid bodies in pax interchange
		 * format, but not in ustar format.  Since there is no
		 * hard and fast way to distinguish pax interchange
		 * from earlier archives (the 'x' and 'g' entries are
		 * optional, after all), we need a heuristic.
		 */
		if (archive_entry_size(entry) == 0) {
			/* If the size is already zero, we're done. */
		}  else if (a->archive.archive_format
		    == ARCHIVE_FORMAT_TAR_PAX_INTERCHANGE) {
			/* Definitely pax extended; must obey hardlink size. */
		} else if (a->archive.archive_format == ARCHIVE_FORMAT_TAR
		    || a->archive.archive_format == ARCHIVE_FORMAT_TAR_GNUTAR)
		{
			/* Old-style or GNU tar: we must ignore the size. */
			archive_entry_set_size(entry, 0);
			tar->entry_bytes_remaining = 0;
		} else if (archive_read_format_tar_bid(a, 50) > 50) {
			/*
			 * We don't know if it's pax: If the bid
			 * function sees a valid ustar header
			 * immediately following, then let's ignore
			 * the hardlink size.
			 */
			archive_entry_set_size(entry, 0);
			tar->entry_bytes_remaining = 0;
		}
		/*
		 * TODO: There are still two cases I'd like to handle:
		 *   = a ustar non-pax archive with a hardlink entry at
		 *     end-of-archive.  (Look for block of nulls following?)
		 *   = a pax archive that has not seen any pax headers
		 *     and has an entry which is a hardlink entry storing
		 *     a body containing an uncompressed tar archive.
		 * The first is worth addressing; I don't see any reliable
		 * way to deal with the second possibility.
		 */
		break;
	case '2': /* Symlink */
		archive_entry_set_filetype(entry, AE_IFLNK);
		archive_entry_set_size(entry, 0);
		tar->entry_bytes_remaining = 0;
		if (archive_entry_copy_symlink_l(entry, tar->entry_linkpath.s,
		    archive_strlen(&(tar->entry_linkpath)), tar->sconv) != 0) {
			err = set_conversion_failed_error(a, tar->sconv,
			    "Linkname");
			if (err == ARCHIVE_FATAL)
				return (err);
		}
		break;
	case '3': /* Character device */
		archive_entry_set_filetype(entry, AE_IFCHR);
		archive_entry_set_size(entry, 0);
		tar->entry_bytes_remaining = 0;
		break;
	case '4': /* Block device */
		archive_entry_set_filetype(entry, AE_IFBLK);
		archive_entry_set_size(entry, 0);
		tar->entry_bytes_remaining = 0;
		break;
	case '5': /* Dir */
		archive_entry_set_filetype(entry, AE_IFDIR);
		archive_entry_set_size(entry, 0);
		tar->entry_bytes_remaining = 0;
		break;
	case '6': /* FIFO device */
		archive_entry_set_filetype(entry, AE_IFIFO);
		archive_entry_set_size(entry, 0);
		tar->entry_bytes_remaining = 0;
		break;
	case 'D': /* GNU incremental directory type */
		/*
		 * No special handling is actually required here.
		 * It might be nice someday to preprocess the file list and
		 * provide it to the client, though.
		 */
		archive_entry_set_filetype(entry, AE_IFDIR);
		break;
	case 'M': /* GNU "Multi-volume" (remainder of file from last archive)*/
		/*
		 * As far as I can tell, this is just like a regular file
		 * entry, except that the contents should be _appended_ to
		 * the indicated file at the indicated offset.  This may
		 * require some API work to fully support.
		 */
		break;
	case 'N': /* Old GNU "long filename" entry. */
		/* The body of this entry is a script for renaming
		 * previously-extracted entries.  Ugh.  It will never
		 * be supported by libarchive. */
		archive_entry_set_filetype(entry, AE_IFREG);
		break;
	case 'S': /* GNU sparse files */
		/*
		 * Sparse files are really just regular files with
		 * sparse information in the extended area.
		 */
		/* FALLTHROUGH */
	case '0':
		/*
		 * Enable sparse file "read" support only for regular
		 * files and explicit GNU sparse files.  However, we
		 * don't allow non-standard file types to be sparse.
		 */
		tar->sparse_allowed = 1;
		/* FALLTHROUGH */
	default: /* Regular file  and non-standard types */
		/*
		 * Per POSIX: non-recognized types should always be
		 * treated as regular files.
		 */
		archive_entry_set_filetype(entry, AE_IFREG);
		break;
	}
	return (err);
}